

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_D3D_start(Context *ctx,char *profilestr)

{
  byte bVar1;
  char minor_str [16];
  char local_28 [24];
  
  bVar1 = ctx->major_ver;
  ctx->ignores_ctab = 1;
  if (ctx->minor_ver == 0xff) {
    local_28[2] = 0;
    local_28[0] = 's';
    local_28[1] = 'w';
  }
  else if (ctx->minor_ver == '\x01' && 1 < bVar1) {
    local_28[0] = 'x';
    local_28[1] = '\0';
  }
  else {
    snprintf(local_28,0x10,"%u");
  }
  output_line(ctx,"%s_%u_%s",ctx->shader_type_str,(ulong)bVar1,local_28);
  return;
}

Assistant:

static void emit_D3D_start(Context *ctx, const char *profilestr)
{
    const uint major = (uint) ctx->major_ver;
    const uint minor = (uint) ctx->minor_ver;
    char minor_str[16];

    ctx->ignores_ctab = 1;

    if (minor == 0xFF)
        strcpy(minor_str, "sw");
    else if ((major > 1) && (minor == 1))
        strcpy(minor_str, "x");  // for >= SM2, apparently this is "x". Weird.
    else
        snprintf(minor_str, sizeof (minor_str), "%u", (uint) minor);

    output_line(ctx, "%s_%u_%s", ctx->shader_type_str, major, minor_str);
}